

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::
FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
          (ExtensionSet *this,int wire_type,int field_number,
          GeneratedExtensionFinder *extension_finder,ExtensionInfo *extension,
          bool *was_packed_on_wire)

{
  uint uVar1;
  EnumValidityFuncWithArg *pEVar2;
  void *pvVar3;
  FieldDescriptor *pFVar4;
  LazyEagerVerifyFnType p_Var5;
  int iVar6;
  FieldType FVar7;
  bool bVar8;
  LazyAnnotation LVar9;
  ExtensionInfo *pEVar10;
  bool bVar11;
  
  pEVar10 = anon_unknown_58::FindRegisteredExtension(extension_finder->extendee_,field_number);
  if (pEVar10 == (ExtensionInfo *)0x0) {
    bVar11 = false;
  }
  else {
    iVar6 = pEVar10->number;
    FVar7 = pEVar10->type;
    bVar11 = pEVar10->is_repeated;
    bVar8 = pEVar10->is_packed;
    LVar9 = pEVar10->is_lazy;
    pEVar2 = (pEVar10->field_6).enum_validity_check.func;
    pvVar3 = (pEVar10->field_6).enum_validity_check.arg;
    pFVar4 = pEVar10->descriptor;
    p_Var5 = pEVar10->lazy_eager_verify_func;
    extension->message = pEVar10->message;
    extension->number = iVar6;
    extension->type = FVar7;
    extension->is_repeated = bVar11;
    extension->is_packed = bVar8;
    extension->is_lazy = LVar9;
    extension->descriptor = pFVar4;
    extension->lazy_eager_verify_func = p_Var5;
    (extension->field_6).enum_validity_check.func = pEVar2;
    (extension->field_6).enum_validity_check.arg = pvVar3;
    if ((byte)(extension->type - 0x13) < 0xee) {
      FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>();
LAB_0014292e:
      FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>();
    }
    uVar1 = *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)extension->type * 4);
    *was_packed_on_wire = false;
    if ((wire_type == 2) && (extension->is_repeated != false)) {
      if (5 < uVar1) goto LAB_0014292e;
      if ((0x1cU >> (uVar1 & 0x1f) & 1) == 0) {
        *was_packed_on_wire = true;
        return true;
      }
    }
    bVar11 = uVar1 == wire_type;
  }
  return bVar11;
}

Assistant:

bool FindExtensionInfoFromFieldNumber(int wire_type, int field_number,
                                        ExtensionFinder* extension_finder,
                                        ExtensionInfo* extension,
                                        bool* was_packed_on_wire) const {
    if (!extension_finder->Find(field_number, extension)) {
      return false;
    }

    ABSL_DCHECK(extension->type > 0 &&
                extension->type <= WireFormatLite::MAX_FIELD_TYPE);
    auto real_type = static_cast<WireFormatLite::FieldType>(extension->type);

    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type);

    // Check if this is a packed field.
    *was_packed_on_wire = false;
    if (extension->is_repeated &&
        wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
        is_packable(expected_wire_type)) {
      *was_packed_on_wire = true;
      return true;
    }
    // Otherwise the wire type must match.
    return expected_wire_type == wire_type;
  }